

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostcheck.c
# Opt level: O0

int hostmatch(char *hostname,char *pattern)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *first;
  char *pcVar4;
  bool bVar5;
  size_t len;
  size_t sStack_50;
  in_addr ignored;
  size_t suffixlen;
  size_t prefixlen;
  int wildcard_enabled;
  char *hostname_label_end;
  char *pattern_wildcard;
  char *pattern_label_end;
  char *pattern_local;
  char *hostname_local;
  
  sVar2 = strlen(hostname);
  if (hostname[sVar2 - 1] == '.') {
    hostname[sVar2 - 1] = '\0';
  }
  sVar2 = strlen(pattern);
  if (pattern[sVar2 - 1] == '.') {
    pattern[sVar2 - 1] = '\0';
  }
  pcVar3 = strchr(pattern,0x2a);
  if (pcVar3 == (char *)0x0) {
    iVar1 = Curl_strcasecompare(pattern,hostname);
    hostname_local._4_4_ = (uint)(iVar1 != 0);
  }
  else {
    iVar1 = inet_pton(2,hostname,(void *)((long)&len + 4));
    if (iVar1 < 1) {
      bVar5 = true;
      first = strchr(pattern,0x2e);
      if ((((first == (char *)0x0) || (pcVar4 = strchr(first + 1,0x2e), pcVar4 == (char *)0x0)) ||
          (first < pcVar3)) || (iVar1 = Curl_strncasecompare(pattern,"xn--",4), iVar1 != 0)) {
        bVar5 = false;
      }
      if (bVar5) {
        pcVar4 = strchr(hostname,0x2e);
        if ((pcVar4 == (char *)0x0) || (iVar1 = Curl_strcasecompare(first,pcVar4), iVar1 == 0)) {
          hostname_local._4_4_ = 0;
        }
        else if ((long)pcVar4 - (long)hostname < (long)first - (long)pattern) {
          hostname_local._4_4_ = 0;
        }
        else {
          sStack_50 = (long)first - (long)(pcVar3 + 1);
          iVar1 = Curl_strncasecompare(pattern,hostname,(long)pcVar3 - (long)pattern);
          bVar5 = false;
          if (iVar1 != 0) {
            iVar1 = Curl_strncasecompare(pcVar3 + 1,pcVar4 + -sStack_50,sStack_50);
            bVar5 = iVar1 != 0;
          }
          hostname_local._4_4_ = (uint)bVar5;
        }
      }
      else {
        iVar1 = Curl_strcasecompare(pattern,hostname);
        hostname_local._4_4_ = (uint)(iVar1 != 0);
      }
    }
    else {
      hostname_local._4_4_ = 0;
    }
  }
  return hostname_local._4_4_;
}

Assistant:

static int hostmatch(char *hostname, char *pattern)
{
  const char *pattern_label_end, *pattern_wildcard, *hostname_label_end;
  int wildcard_enabled;
  size_t prefixlen, suffixlen;
  struct in_addr ignored;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 si6;
#endif

  /* normalize pattern and hostname by stripping off trailing dots */
  size_t len = strlen(hostname);
  if(hostname[len-1]=='.')
    hostname[len-1]=0;
  len = strlen(pattern);
  if(pattern[len-1]=='.')
    pattern[len-1]=0;

  pattern_wildcard = strchr(pattern, '*');
  if(pattern_wildcard == NULL)
    return strcasecompare(pattern, hostname) ?
      CURL_HOST_MATCH : CURL_HOST_NOMATCH;

  /* detect IP address as hostname and fail the match if so */
  if(Curl_inet_pton(AF_INET, hostname, &ignored) > 0)
    return CURL_HOST_NOMATCH;
#ifdef ENABLE_IPV6
  if(Curl_inet_pton(AF_INET6, hostname, &si6.sin6_addr) > 0)
    return CURL_HOST_NOMATCH;
#endif

  /* We require at least 2 dots in pattern to avoid too wide wildcard
     match. */
  wildcard_enabled = 1;
  pattern_label_end = strchr(pattern, '.');
  if(pattern_label_end == NULL || strchr(pattern_label_end+1, '.') == NULL ||
     pattern_wildcard > pattern_label_end ||
     strncasecompare(pattern, "xn--", 4)) {
    wildcard_enabled = 0;
  }
  if(!wildcard_enabled)
    return strcasecompare(pattern, hostname) ?
      CURL_HOST_MATCH : CURL_HOST_NOMATCH;

  hostname_label_end = strchr(hostname, '.');
  if(hostname_label_end == NULL ||
     !strcasecompare(pattern_label_end, hostname_label_end))
    return CURL_HOST_NOMATCH;

  /* The wildcard must match at least one character, so the left-most
     label of the hostname is at least as large as the left-most label
     of the pattern. */
  if(hostname_label_end - hostname < pattern_label_end - pattern)
    return CURL_HOST_NOMATCH;

  prefixlen = pattern_wildcard - pattern;
  suffixlen = pattern_label_end - (pattern_wildcard+1);
  return strncasecompare(pattern, hostname, prefixlen) &&
    strncasecompare(pattern_wildcard+1, hostname_label_end - suffixlen,
                    suffixlen) ?
    CURL_HOST_MATCH : CURL_HOST_NOMATCH;
}